

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWOB
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  uint16_t *puVar1;
  uint uVar2;
  ushort *puVar3;
  runtime_error *prVar4;
  int iVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar3 = *cursor;
  if (puVar3 < end) {
    iVar5 = max + 1;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        return;
      }
      if ((long)end - (long)puVar3 < 3) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"LWOB: Unexpected end of file","");
        std::runtime_error::runtime_error(prVar4,(string *)local_50);
        *(undefined ***)prVar4 = &PTR__runtime_error_007da4b8;
        __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      *cursor = puVar3 + 1;
      if ((long)end - (long)(puVar3 + 1) >> 1 < (long)((ulong)*puVar3 + 1)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"LWOB: Unexpected end of file","");
        std::runtime_error::runtime_error(prVar4,(string *)local_50);
        *(undefined ***)prVar4 = &PTR__runtime_error_007da4b8;
        __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = (uint)*puVar3;
      *verts = *verts + uVar2;
      *faces = *faces + 1;
      puVar1 = *cursor;
      puVar3 = puVar1 + uVar2 + 1;
      *cursor = puVar3;
      if ((short)puVar1[uVar2] < 0) {
        *cursor = puVar1 + (ulong)uVar2 + 2;
        CountVertsAndFacesLWOB(this,verts,faces,cursor,end,(uint)puVar1[(ulong)uVar2 + 1]);
        puVar3 = *cursor;
      }
    } while (puVar3 < end);
  }
  return;
}

Assistant:

void LWOImporter::CountVertsAndFacesLWOB(unsigned int& verts, unsigned int& faces,
    LE_NCONST uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        // must have 2 shorts left for numIndices and surface
        if (end - cursor < 2) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        ::memcpy(&numIndices, cursor++, 2);
        // must have enough left for indices and surface
        if (end - cursor < (1 + numIndices)) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        verts += numIndices;
        faces++;
        cursor += numIndices;
        int16_t surface;
        ::memcpy(&surface, cursor++, 2);
        if (surface < 0)
        {
            // there are detail polygons
            ::memcpy(&numIndices, cursor++, 2);
            CountVertsAndFacesLWOB(verts,faces,cursor,end,numIndices);
        }
    }
}